

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3StartTable(Parse *pParse,Token *pName1,Token *pName2,int isTemp,int isView,int isVirtual
                      ,int noErr)

{
  sqlite3 *psVar1;
  int iVar2;
  int iVar3;
  int i;
  int p2;
  int p3;
  int iVar4;
  char *__s1;
  Table *pTVar5;
  Index *pIVar6;
  Vdbe *p;
  int in_ECX;
  long in_RDX;
  Parse *in_RDI;
  int in_R8D;
  int in_R9D;
  int reg3;
  int reg2;
  int reg1;
  int fileFormat;
  int j1;
  char *zDb_1;
  char *zDb;
  int code;
  Token *pName;
  int iDb;
  Vdbe *v;
  sqlite3 *db;
  char *zName;
  Table *pTable;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  Parse *in_stack_ffffffffffffff90;
  Parse *in_stack_ffffffffffffff98;
  Vdbe *p_00;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Parse *in_stack_ffffffffffffffa8;
  int local_4c;
  int local_1c;
  
  psVar1 = in_RDI->db;
  local_4c = sqlite3TwoPartName(in_stack_ffffffffffffff98,(Token *)in_stack_ffffffffffffff90,
                                (Token *)CONCAT44(in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88),
                                (Token **)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (local_4c < 0) {
    return;
  }
  if (((in_ECX != 0) && (*(int *)(in_RDX + 8) != 0)) && (local_4c != 1)) {
    sqlite3ErrorMsg(in_RDI,"temporary table name must be unqualified");
    return;
  }
  if (in_ECX != 0) {
    local_4c = 1;
  }
  (in_RDI->sNameToken).z = (char *)in_stack_ffffffffffffffa8->db;
  *(char **)&(in_RDI->sNameToken).n = in_stack_ffffffffffffffa8->zErrMsg;
  __s1 = sqlite3NameFromToken
                   ((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    (Token *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (__s1 == (char *)0x0) {
    return;
  }
  iVar2 = sqlite3CheckObjectName
                    ((Parse *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (char *)0x16495b);
  if (iVar2 == 0) {
    local_1c = in_ECX;
    if ((psVar1->init).iDb == '\x01') {
      local_1c = 1;
    }
    p_00 = (Vdbe *)psVar1->aDb[local_4c].zName;
    iVar2 = sqlite3AuthCheck(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,(char *)p_00,
                             (char *)in_stack_ffffffffffffff90,
                             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (iVar2 == 0) {
      if (in_R8D == 0) {
        if (local_1c == 0) {
          iVar2 = 2;
        }
        else {
          iVar2 = 4;
        }
      }
      else if (local_1c == 0) {
        iVar2 = 8;
      }
      else {
        iVar2 = 6;
      }
      if ((in_R9D != 0) ||
         (iVar3 = sqlite3AuthCheck(in_stack_ffffffffffffffa8,iVar2,(char *)p_00,
                                   (char *)in_stack_ffffffffffffff90,
                                   (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                                    in_stack_ffffffffffffff88)), iVar3 == 0)) {
        if (in_RDI->declareVtab == '\0') {
          in_stack_ffffffffffffff90 = (Parse *)psVar1->aDb[local_4c].zName;
          iVar3 = sqlite3ReadSchema((Parse *)CONCAT44(in_stack_ffffffffffffff84,
                                                      in_stack_ffffffffffffff80));
          if (iVar3 != 0) goto LAB_00164e65;
          pTVar5 = sqlite3FindTable((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                                    (char *)p_00,(char *)in_stack_ffffffffffffff90);
          if (pTVar5 != (Table *)0x0) {
            if (reg2 == 0) {
              sqlite3ErrorMsg(in_RDI,"table %T already exists",in_stack_ffffffffffffffa8);
            }
            else {
              sqlite3CodeVerifySchema(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
            }
            goto LAB_00164e65;
          }
          pIVar6 = sqlite3FindIndex((sqlite3 *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
                                    (char *)p_00,(char *)in_stack_ffffffffffffff90);
          if (pIVar6 != (Index *)0x0) {
            sqlite3ErrorMsg(in_RDI,"there is already an index named %s",__s1);
            goto LAB_00164e65;
          }
        }
        pTVar5 = (Table *)sqlite3DbMallocZero((sqlite3 *)
                                              CONCAT44(in_stack_ffffffffffffff84,
                                                       in_stack_ffffffffffffff80),
                                              CONCAT44(in_stack_ffffffffffffff7c,
                                                       in_stack_ffffffffffffff78));
        if (pTVar5 != (Table *)0x0) {
          pTVar5->zName = __s1;
          pTVar5->iPKey = -1;
          pTVar5->pSchema = psVar1->aDb[local_4c].pSchema;
          pTVar5->nRef = 1;
          pTVar5->nRowLogEst = 200;
          in_RDI->pNewTable = pTVar5;
          if ((in_RDI->nested == '\0') && (iVar2 = strcmp(__s1,"sqlite_sequence"), iVar2 == 0)) {
            pTVar5->pSchema->pSeqTab = pTVar5;
          }
          if ((psVar1->init).busy != '\0') {
            return;
          }
          p = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80))
          ;
          if (p == (Vdbe *)0x0) {
            return;
          }
          sqlite3BeginWriteOperation
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
          if (in_R9D != 0) {
            sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                              in_stack_ffffffffffffff7c);
          }
          iVar2 = in_RDI->nMem + 1;
          in_RDI->nMem = iVar2;
          in_RDI->regRowid = iVar2;
          iVar3 = in_RDI->nMem + 1;
          in_RDI->nMem = iVar3;
          in_RDI->regRoot = iVar3;
          i = in_RDI->nMem + 1;
          in_RDI->nMem = i;
          sqlite3VdbeAddOp3(p_00,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                            (int)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,
                            in_stack_ffffffffffffff88);
          sqlite3VdbeUsesBtree((Vdbe *)CONCAT44(iVar2,iVar3),i);
          p2 = sqlite3VdbeAddOp1((Vdbe *)CONCAT44(iVar2,iVar3),i,in_stack_ffffffffffffff78);
          p3 = 4;
          if ((psVar1->flags & 0x8000U) != 0) {
            p3 = 1;
          }
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(iVar2,iVar3),i,in_stack_ffffffffffffff78,0);
          sqlite3VdbeAddOp3(p_00,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                            (int)in_stack_ffffffffffffff90,p2,p3);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(iVar2,iVar3),i,in_stack_ffffffffffffff78,0);
          sqlite3VdbeAddOp3(p_00,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                            (int)in_stack_ffffffffffffff90,p2,p3);
          sqlite3VdbeJumpHere((Vdbe *)CONCAT44(iVar2,iVar3),i);
          if ((in_R8D == 0) && (in_R9D == 0)) {
            iVar4 = sqlite3VdbeAddOp2((Vdbe *)CONCAT44(iVar2,iVar3),i,in_stack_ffffffffffffff78,0);
            in_RDI->addrCrTab = iVar4;
          }
          else {
            sqlite3VdbeAddOp2((Vdbe *)CONCAT44(iVar2,iVar3),i,in_stack_ffffffffffffff78,0);
          }
          sqlite3OpenMasterTable((Parse *)CONCAT44(iVar2,iVar3),i);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(iVar2,iVar3),i,in_stack_ffffffffffffff78,0);
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(iVar2,iVar3),i,in_stack_ffffffffffffff78,0);
          sqlite3VdbeAddOp3(p_00,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                            (int)in_stack_ffffffffffffff90,p2,p3);
          sqlite3VdbeChangeP5(p,'\b');
          sqlite3VdbeAddOp0((Vdbe *)CONCAT44(iVar2,iVar3),i);
          return;
        }
        psVar1->mallocFailed = '\x01';
        in_RDI->rc = 7;
        in_RDI->nErr = in_RDI->nErr + 1;
      }
    }
  }
LAB_00164e65:
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                (void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StartTable(
  Parse *pParse,   /* Parser context */
  Token *pName1,   /* First part of the name of the table or view */
  Token *pName2,   /* Second part of the name of the table or view */
  int isTemp,      /* True if this is a TEMP table */
  int isView,      /* True if this is a VIEW */
  int isVirtual,   /* True if this is a VIRTUAL table */
  int noErr        /* Do nothing if table already exists */
){
  Table *pTable;
  char *zName = 0; /* The name of the new table */
  sqlite3 *db = pParse->db;
  Vdbe *v;
  int iDb;         /* Database number to create the table in */
  Token *pName;    /* Unqualified name of the table to create */

  /* The table or view name to create is passed to this routine via tokens
  ** pName1 and pName2. If the table name was fully qualified, for example:
  **
  ** CREATE TABLE xxx.yyy (...);
  ** 
  ** Then pName1 is set to "xxx" and pName2 "yyy". On the other hand if
  ** the table name is not fully qualified, i.e.:
  **
  ** CREATE TABLE yyy(...);
  **
  ** Then pName1 is set to "yyy" and pName2 is "".
  **
  ** The call below sets the pName pointer to point at the token (pName1 or
  ** pName2) that stores the unqualified table name. The variable iDb is
  ** set to the index of the database that the table or view is to be
  ** created in.
  */
  iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
  if( iDb<0 ) return;
  if( !OMIT_TEMPDB && isTemp && pName2->n>0 && iDb!=1 ){
    /* If creating a temp table, the name may not be qualified. Unless 
    ** the database name is "temp" anyway.  */
    sqlite3ErrorMsg(pParse, "temporary table name must be unqualified");
    return;
  }
  if( !OMIT_TEMPDB && isTemp ) iDb = 1;

  pParse->sNameToken = *pName;
  zName = sqlite3NameFromToken(db, pName);
  if( zName==0 ) return;
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
    goto begin_table_error;
  }
  if( db->init.iDb==1 ) isTemp = 1;
#ifndef SQLITE_OMIT_AUTHORIZATION
  assert( (isTemp & 1)==isTemp );
  {
    int code;
    char *zDb = db->aDb[iDb].zName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(isTemp), 0, zDb) ){
      goto begin_table_error;
    }
    if( isView ){
      if( !OMIT_TEMPDB && isTemp ){
        code = SQLITE_CREATE_TEMP_VIEW;
      }else{
        code = SQLITE_CREATE_VIEW;
      }
    }else{
      if( !OMIT_TEMPDB && isTemp ){
        code = SQLITE_CREATE_TEMP_TABLE;
      }else{
        code = SQLITE_CREATE_TABLE;
      }
    }
    if( !isVirtual && sqlite3AuthCheck(pParse, code, zName, 0, zDb) ){
      goto begin_table_error;
    }
  }
#endif

  /* Make sure the new table name does not collide with an existing
  ** index or table name in the same database.  Issue an error message if
  ** it does. The exception is if the statement being parsed was passed
  ** to an sqlite3_declare_vtab() call. In that case only the column names
  ** and types will be used, so there is no need to test for namespace
  ** collisions.
  */
  if( !IN_DECLARE_VTAB ){
    char *zDb = db->aDb[iDb].zName;
    if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
      goto begin_table_error;
    }
    pTable = sqlite3FindTable(db, zName, zDb);
    if( pTable ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "table %T already exists", pName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto begin_table_error;
    }
    if( sqlite3FindIndex(db, zName, zDb)!=0 ){
      sqlite3ErrorMsg(pParse, "there is already an index named %s", zName);
      goto begin_table_error;
    }
  }

  pTable = sqlite3DbMallocZero(db, sizeof(Table));
  if( pTable==0 ){
    db->mallocFailed = 1;
    pParse->rc = SQLITE_NOMEM;
    pParse->nErr++;
    goto begin_table_error;
  }
  pTable->zName = zName;
  pTable->iPKey = -1;
  pTable->pSchema = db->aDb[iDb].pSchema;
  pTable->nRef = 1;
  pTable->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
  assert( pParse->pNewTable==0 );
  pParse->pNewTable = pTable;

  /* If this is the magic sqlite_sequence table used by autoincrement,
  ** then record a pointer to this table in the main database structure
  ** so that INSERT can find the table easily.
  */
#ifndef SQLITE_OMIT_AUTOINCREMENT
  if( !pParse->nested && strcmp(zName, "sqlite_sequence")==0 ){
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pTable->pSchema->pSeqTab = pTable;
  }
#endif

  /* Begin generating the code that will insert the table record into
  ** the SQLITE_MASTER table.  Note in particular that we must go ahead
  ** and allocate the record number for the table entry now.  Before any
  ** PRIMARY KEY or UNIQUE keywords are parsed.  Those keywords will cause
  ** indices to be created and the table record must come before the 
  ** indices.  Hence, the record number for the table must be allocated
  ** now.
  */
  if( !db->init.busy && (v = sqlite3GetVdbe(pParse))!=0 ){
    int j1;
    int fileFormat;
    int reg1, reg2, reg3;
    sqlite3BeginWriteOperation(pParse, 0, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( isVirtual ){
      sqlite3VdbeAddOp0(v, OP_VBegin);
    }
#endif

    /* If the file format and encoding in the database have not been set, 
    ** set them now.
    */
    reg1 = pParse->regRowid = ++pParse->nMem;
    reg2 = pParse->regRoot = ++pParse->nMem;
    reg3 = ++pParse->nMem;
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, reg3, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    j1 = sqlite3VdbeAddOp1(v, OP_If, reg3); VdbeCoverage(v);
    fileFormat = (db->flags & SQLITE_LegacyFileFmt)!=0 ?
                  1 : SQLITE_MAX_FILE_FORMAT;
    sqlite3VdbeAddOp2(v, OP_Integer, fileFormat, reg3);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, reg3);
    sqlite3VdbeAddOp2(v, OP_Integer, ENC(db), reg3);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_TEXT_ENCODING, reg3);
    sqlite3VdbeJumpHere(v, j1);

    /* This just creates a place-holder record in the sqlite_master table.
    ** The record created does not contain anything yet.  It will be replaced
    ** by the real entry in code generated at sqlite3EndTable().
    **
    ** The rowid for the new entry is left in register pParse->regRowid.
    ** The root page number of the new table is left in reg pParse->regRoot.
    ** The rowid and root page number values are needed by the code that
    ** sqlite3EndTable will generate.
    */
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
    if( isView || isVirtual ){
      sqlite3VdbeAddOp2(v, OP_Integer, 0, reg2);
    }else
#endif
    {
      pParse->addrCrTab = sqlite3VdbeAddOp2(v, OP_CreateTable, iDb, reg2);
    }
    sqlite3OpenMasterTable(pParse, iDb);
    sqlite3VdbeAddOp2(v, OP_NewRowid, 0, reg1);
    sqlite3VdbeAddOp2(v, OP_Null, 0, reg3);
    sqlite3VdbeAddOp3(v, OP_Insert, 0, reg3, reg1);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeAddOp0(v, OP_Close);
  }

  /* Normal (non-error) return. */
  return;

  /* If an error occurs, we jump here */
begin_table_error:
  sqlite3DbFree(db, zName);
  return;
}